

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec2.c
# Opt level: O1

bool_t ec2CreateLD(ec_o *ec,qr_o *f,octet *A,octet *B,void *stack)

{
  long lVar1;
  size_t sVar2;
  size_t sVar3;
  bool_t bVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  bool_t bVar10;
  
  memSet(ec,'\0',0xb0);
  ec->d = 3;
  ec->f = f;
  ec->A = (word *)(ec + 1);
  ec->B = &ec[1].hdr.keep + f->n;
  bVar4 = (*f->from)((word *)(ec + 1),A,f,stack);
  bVar10 = 0;
  if (bVar4 != 0) {
    bVar4 = (*ec->f->from)(ec->B,B,ec->f,stack);
    bVar10 = 0;
    if (bVar4 != 0) {
      sVar9 = f->n;
      ec->base = ec->B + sVar9;
      ec->order = ec->B + sVar9 + f->n * 2;
      ec->froma = ec2FromALD;
      ec->toa = ec2ToALD;
      ec->neg = ec2NegLD;
      ec->add = ec2AddLD;
      ec->adda = ec2AddALD;
      ec->sub = ec2SubLD;
      ec->suba = ec2SubALD;
      ec->dbl = ec2DblLD;
      ec->dbla = ec2DblALD;
      sVar9 = f->n;
      sVar2 = f->deep;
      lVar1 = sVar2 + sVar9 * 8;
      sVar5 = utilMax(2,sVar2,sVar9 * 0x10 + sVar2);
      sVar2 = f->n;
      sVar6 = utilMax(2,f->deep,f->deep + sVar2 * 8);
      sVar7 = ec2SubLD_deep(f->n,f->deep);
      sVar3 = f->n;
      sVar8 = utilMax(2,f->deep,f->deep + sVar3 * 8);
      sVar9 = utilMax(8,lVar1,lVar1,sVar9 * 0x30 + sVar5,sVar2 * 0x20 + sVar6,sVar7,
                      sVar3 * 0x30 + sVar8,f->n * 0x10 + f->deep,f->deep + f->n * 8);
      ec->deep = sVar9;
      (ec->hdr).keep = f->n * 0x28 + 0xb8;
      (ec->hdr).p_count = 6;
      (ec->hdr).o_count = 1;
      bVar10 = 1;
    }
  }
  return bVar10;
}

Assistant:

bool_t ec2CreateLD(ec_o* ec, const qr_o* f, const octet A[], const octet B[],
	void* stack)
{
	ASSERT(memIsValid(ec, sizeof(ec_o)));
	ASSERT(gf2IsOperable(f));
	ASSERT(memIsValid(A, f->no));
	ASSERT(memIsValid(B, f->no));
	// обнулить
	memSetZero(ec, sizeof(ec_o));
	// зафикисровать размерности
	ec->d = 3;
	// запомнить базовое поле
	ec->f = f;
	// сохранить коэффициенты
	ec->A = (word*)ec->descr;
	ec->B = ec->A + f->n;
	if (!qrFrom(ec->A, A, ec->f, stack) || !qrFrom(ec->B, B, ec->f, stack))
		return FALSE;
	// подготовить буферы для описания группы точек
	ec->base = ec->B + f->n;
	ec->order = ec->base + 2 * f->n;
	// настроить интерфейсы
	ec->froma = ec2FromALD;
	ec->toa = ec2ToALD;
	ec->neg = ec2NegLD;
	ec->add = ec2AddLD;
	ec->adda = ec2AddALD;
	ec->sub = ec2SubLD;
	ec->suba = ec2SubALD;
	ec->dbl = ec2DblLD;
	ec->dbla = ec2DblALD;
	ec->deep = utilMax(8,
		ec2ToALD_deep(f->n, f->deep),
		ec2NegLD_deep(f->n, f->deep),
		ec2AddLD_deep(f->n, f->deep),
		ec2AddALD_deep(f->n, f->deep),
		ec2SubLD_deep(f->n, f->deep),
		ec2SubALD_deep(f->n, f->deep),
		ec2DblLD_deep(f->n, f->deep),
		ec2DblALD_deep(f->n, f->deep));
	// настроить заголовок
	ec->hdr.keep = sizeof(ec_o) + O_OF_W(5 * f->n + 1);
	ec->hdr.p_count = 6;
	ec->hdr.o_count = 1;
	// все нормально
	return TRUE;
}